

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_joinref.cpp
# Opt level: O0

BindingAlias * __thiscall
duckdb::Binder::RetrieveUsingBinding
          (Binder *this,Binder *current_binder,
          optional_ptr<duckdb::UsingColumnSet,_true> current_set,string *using_column,
          string *join_side)

{
  bool bVar1;
  UsingColumnSet *pUVar2;
  string *in_RCX;
  string *in_RSI;
  Binder *in_RDI;
  BindingAlias *binding;
  BindingAlias *in_stack_ffffffffffffff38;
  Binder *this_00;
  Binder *this_01;
  
  this_00 = in_RDI;
  this_01 = in_RDI;
  BindingAlias::BindingAlias((BindingAlias *)in_RDI);
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&stack0xfffffffffffffff0);
  if (bVar1) {
    pUVar2 = optional_ptr<duckdb::UsingColumnSet,_true>::operator->
                       ((optional_ptr<duckdb::UsingColumnSet,_true> *)this_00);
    BindingAlias::operator=((BindingAlias *)this_00,&pUVar2->primary_binding);
  }
  else {
    FindBinding(this_01,in_RCX,in_RSI);
    BindingAlias::operator=((BindingAlias *)this_00,in_stack_ffffffffffffff38);
    BindingAlias::~BindingAlias((BindingAlias *)this_00);
  }
  return (BindingAlias *)in_RDI;
}

Assistant:

BindingAlias Binder::RetrieveUsingBinding(Binder &current_binder, optional_ptr<UsingColumnSet> current_set,
                                          const string &using_column, const string &join_side) {
	BindingAlias binding;
	if (!current_set) {
		binding = current_binder.FindBinding(using_column, join_side);
	} else {
		binding = current_set->primary_binding;
	}
	return binding;
}